

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O1

void fdct16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  __m256i alVar1;
  __m256i alVar2;
  __m256i alVar3;
  __m256i alVar4;
  __m256i alVar5;
  __m256i alVar6;
  __m256i alVar7;
  __m256i alVar8;
  __m256i alVar9;
  __m256i alVar10;
  __m256i alVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  long lVar19;
  int iVar20;
  uint uVar21;
  undefined7 in_register_00000011;
  uint uVar22;
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  longlong local_108;
  longlong lStack_100;
  longlong lStack_f8;
  longlong lStack_f0;
  longlong local_e8;
  longlong lStack_e0;
  longlong lStack_d8;
  longlong lStack_d0;
  longlong local_c8;
  longlong lStack_c0;
  longlong lStack_b8;
  longlong lStack_b0;
  longlong local_a8;
  longlong lStack_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong local_88;
  longlong lStack_80;
  longlong lStack_78;
  longlong lStack_70;
  
  auVar12 = vpaddsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0xf]);
  auVar41 = vpsubsw_avx2((undefined1  [32])*input,(undefined1  [32])input[0xf]);
  auVar13 = vpaddsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0xe]);
  auVar33 = vpsubsw_avx2((undefined1  [32])input[1],(undefined1  [32])input[0xe]);
  auVar14 = vpaddsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0xd]);
  auVar35 = vpsubsw_avx2((undefined1  [32])input[2],(undefined1  [32])input[0xd]);
  auVar15 = vpaddsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[0xc]);
  auVar39 = vpsubsw_avx2((undefined1  [32])input[3],(undefined1  [32])input[0xc]);
  auVar16 = vpaddsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[0xb]);
  auVar40 = vpsubsw_avx2((undefined1  [32])input[4],(undefined1  [32])input[0xb]);
  auVar29 = vpaddsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[10]);
  auVar36 = vpsubsw_avx2((undefined1  [32])input[5],(undefined1  [32])input[10]);
  auVar30 = vpaddsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[9]);
  auVar34 = vpsubsw_avx2((undefined1  [32])input[6],(undefined1  [32])input[9]);
  auVar32 = vpaddsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[8]);
  auVar43 = vpsubsw_avx2((undefined1  [32])input[7],(undefined1  [32])input[8]);
  auVar17 = vpaddsw_avx2(auVar32,auVar12);
  auVar38 = vpsubsw_avx2(auVar12,auVar32);
  auVar32 = vpaddsw_avx2(auVar30,auVar13);
  auVar18 = vpsubsw_avx2(auVar13,auVar30);
  auVar30 = vpaddsw_avx2(auVar29,auVar14);
  auVar26 = vpsubsw_avx2(auVar14,auVar29);
  auVar31 = vpaddsw_avx2(auVar15,auVar16);
  auVar37 = vpsubsw_avx2(auVar15,auVar16);
  auVar13 = vpunpcklwd_avx2(auVar36,auVar35);
  auVar15 = vpunpckhwd_avx2(auVar36,auVar35);
  uVar23 = (uint)CONCAT71(in_register_00000011,cos_bit);
  lVar19 = (long)(int)uVar23 * 0x100;
  iVar20 = 1 << (cos_bit - 1U & 0x1f);
  auVar24._4_4_ = iVar20;
  auVar24._0_4_ = iVar20;
  auVar24._8_4_ = iVar20;
  auVar24._12_4_ = iVar20;
  auVar24._16_4_ = iVar20;
  auVar24._20_4_ = iVar20;
  auVar24._24_4_ = iVar20;
  auVar24._28_4_ = iVar20;
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x1e0);
  uVar22 = -uVar21 & 0xffff | uVar21 * 0x10000;
  auVar28._4_4_ = uVar22;
  auVar28._0_4_ = uVar22;
  auVar28._8_4_ = uVar22;
  auVar28._12_4_ = uVar22;
  auVar28._16_4_ = uVar22;
  auVar28._20_4_ = uVar22;
  auVar28._24_4_ = uVar22;
  auVar28._28_4_ = uVar22;
  iVar20 = uVar21 * 0x10000 + (uVar21 & 0xffff);
  auVar42._4_4_ = iVar20;
  auVar42._0_4_ = iVar20;
  auVar42._8_4_ = iVar20;
  auVar42._12_4_ = iVar20;
  auVar42._16_4_ = iVar20;
  auVar42._20_4_ = iVar20;
  auVar42._24_4_ = iVar20;
  auVar42._28_4_ = iVar20;
  auVar12 = vpmaddwd_avx2(auVar13,auVar28);
  auVar14 = vpmaddwd_avx2(auVar42,auVar13);
  auVar13 = vpmaddwd_avx2(auVar15,auVar28);
  auVar15 = vpmaddwd_avx2(auVar42,auVar15);
  auVar12 = vpaddd_avx2(auVar12,auVar24);
  auVar13 = vpaddd_avx2(auVar13,auVar24);
  auVar14 = vpaddd_avx2(auVar14,auVar24);
  auVar15 = vpaddd_avx2(auVar15,auVar24);
  auVar12 = vpsrad_avx2(auVar12,ZEXT416(uVar23));
  auVar13 = vpsrad_avx2(auVar13,ZEXT416(uVar23));
  auVar25 = ZEXT416(uVar23);
  auVar14 = vpsrad_avx2(auVar14,auVar25);
  auVar15 = vpsrad_avx2(auVar15,auVar25);
  auVar12 = vpackssdw_avx2(auVar12,auVar13);
  auVar13 = vpackssdw_avx2(auVar14,auVar15);
  auVar15 = vpunpcklwd_avx2(auVar40,auVar39);
  auVar29 = vpunpckhwd_avx2(auVar40,auVar39);
  auVar14 = vpmaddwd_avx2(auVar15,auVar28);
  auVar16 = vpmaddwd_avx2(auVar42,auVar15);
  auVar15 = vpmaddwd_avx2(auVar29,auVar28);
  auVar29 = vpmaddwd_avx2(auVar42,auVar29);
  auVar14 = vpaddd_avx2(auVar14,auVar24);
  auVar15 = vpaddd_avx2(auVar15,auVar24);
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  auVar29 = vpaddd_avx2(auVar29,auVar24);
  auVar14 = vpsrad_avx2(auVar14,auVar25);
  auVar15 = vpsrad_avx2(auVar15,auVar25);
  auVar25 = ZEXT416(uVar23);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  auVar14 = vpackssdw_avx2(auVar14,auVar15);
  auVar15 = vpackssdw_avx2(auVar16,auVar29);
  auVar35 = vpaddsw_avx2(auVar17,auVar31);
  auVar36 = vpsubsw_avx2(auVar17,auVar31);
  auVar17 = vpaddsw_avx2(auVar32,auVar30);
  auVar27 = vpsubsw_avx2(auVar32,auVar30);
  auVar30 = vpunpcklwd_avx2(auVar26,auVar18);
  auVar32 = vpunpckhwd_avx2(auVar26,auVar18);
  auVar16 = vpmaddwd_avx2(auVar30,auVar28);
  auVar29 = vpmaddwd_avx2(auVar32,auVar28);
  auVar30 = vpmaddwd_avx2(auVar30,auVar42);
  auVar32 = vpmaddwd_avx2(auVar32,auVar42);
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  auVar29 = vpaddd_avx2(auVar29,auVar24);
  auVar30 = vpaddd_avx2(auVar30,auVar24);
  auVar32 = vpaddd_avx2(auVar32,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar32 = vpsrad_avx2(auVar32,auVar25);
  auVar16 = vpackssdw_avx2(auVar16,auVar29);
  auVar29 = vpackssdw_avx2(auVar30,auVar32);
  auVar39 = vpaddsw_avx2(auVar43,auVar14);
  auVar43 = vpsubsw_avx2(auVar43,auVar14);
  auVar32 = vpaddsw_avx2(auVar12,auVar34);
  auVar34 = vpsubsw_avx2(auVar34,auVar12);
  auVar40 = vpaddsw_avx2(auVar41,auVar15);
  auVar18 = vpsubsw_avx2(auVar41,auVar15);
  auVar31 = vpaddsw_avx2(auVar33,auVar13);
  auVar33 = vpsubsw_avx2(auVar33,auVar13);
  auVar14 = vpunpcklwd_avx2(auVar35,auVar17);
  auVar15 = vpunpckhwd_avx2(auVar35,auVar17);
  iVar20 = (uVar21 & 0xffff) + uVar21 * -0x10000;
  auVar30._4_4_ = iVar20;
  auVar30._0_4_ = iVar20;
  auVar30._8_4_ = iVar20;
  auVar30._12_4_ = iVar20;
  auVar30._16_4_ = iVar20;
  auVar30._20_4_ = iVar20;
  auVar30._24_4_ = iVar20;
  auVar30._28_4_ = iVar20;
  auVar12 = vpmaddwd_avx2(auVar42,auVar14);
  auVar13 = vpmaddwd_avx2(auVar42,auVar15);
  auVar14 = vpmaddwd_avx2(auVar14,auVar30);
  auVar12 = vpaddd_avx2(auVar12,auVar24);
  auVar13 = vpaddd_avx2(auVar13,auVar24);
  auVar12 = vpsrad_avx2(auVar12,auVar25);
  auVar13 = vpsrad_avx2(auVar13,auVar25);
  auVar15 = vpmaddwd_avx2(auVar15,auVar30);
  auVar12 = vpackssdw_avx2(auVar12,auVar13);
  auVar13 = vpaddd_avx2(auVar14,auVar24);
  auVar14 = vpaddd_avx2(auVar15,auVar24);
  auVar25 = ZEXT416(uVar23);
  auVar13 = vpsrad_avx2(auVar13,auVar25);
  auVar14 = vpsrad_avx2(auVar14,auVar25);
  auVar13 = vpackssdw_avx2(auVar13,auVar14);
  auVar17 = vpunpcklwd_avx2(auVar27,auVar36);
  auVar30 = vpunpckhwd_avx2(auVar27,auVar36);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x220);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x1a0);
  uVar22 = uVar21 & 0xffff | iVar20 * 0x10000;
  auVar27._4_4_ = uVar22;
  auVar27._0_4_ = uVar22;
  auVar27._8_4_ = uVar22;
  auVar27._12_4_ = uVar22;
  auVar27._16_4_ = uVar22;
  auVar27._20_4_ = uVar22;
  auVar27._24_4_ = uVar22;
  auVar27._28_4_ = uVar22;
  auVar14 = vpmaddwd_avx2(auVar17,auVar27);
  auVar14 = vpaddd_avx2(auVar14,auVar24);
  auVar15 = vpmaddwd_avx2(auVar30,auVar27);
  auVar15 = vpaddd_avx2(auVar15,auVar24);
  auVar14 = vpsrad_avx2(auVar14,auVar25);
  auVar15 = vpsrad_avx2(auVar15,auVar25);
  auVar14 = vpackssdw_avx2(auVar14,auVar15);
  uVar22 = uVar21 << 0x10 | -iVar20 & 0xffffU;
  auVar26._4_4_ = uVar22;
  auVar26._0_4_ = uVar22;
  auVar26._8_4_ = uVar22;
  auVar26._12_4_ = uVar22;
  auVar26._16_4_ = uVar22;
  auVar26._20_4_ = uVar22;
  auVar26._24_4_ = uVar22;
  auVar26._28_4_ = uVar22;
  auVar15 = vpmaddwd_avx2(auVar17,auVar26);
  auVar30 = vpmaddwd_avx2(auVar30,auVar26);
  auVar15 = vpaddd_avx2(auVar15,auVar24);
  auVar30 = vpaddd_avx2(auVar30,auVar24);
  auVar15 = vpsrad_avx2(auVar15,auVar25);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar15 = vpackssdw_avx2(auVar15,auVar30);
  auVar35 = vpaddsw_avx2(auVar16,auVar37);
  auVar36 = vpsubsw_avx2(auVar37,auVar16);
  auVar41 = vpaddsw_avx2(auVar29,auVar38);
  auVar38 = vpsubsw_avx2(auVar38,auVar29);
  auVar29 = vpunpcklwd_avx2(auVar32,auVar31);
  auVar32 = vpunpckhwd_avx2(auVar32,auVar31);
  auVar16 = vpmaddwd_avx2(auVar29,auVar26);
  auVar30 = vpmaddwd_avx2(auVar29,auVar27);
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  auVar29 = vpmaddwd_avx2(auVar32,auVar26);
  auVar29 = vpaddd_avx2(auVar29,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  auVar32 = vpmaddwd_avx2(auVar32,auVar27);
  auVar16 = vpackssdw_avx2(auVar16,auVar29);
  auVar29 = vpaddd_avx2(auVar30,auVar24);
  auVar30 = vpaddd_avx2(auVar32,auVar24);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar29 = vpackssdw_avx2(auVar29,auVar30);
  auVar17 = vpunpcklwd_avx2(auVar34,auVar33);
  auVar31 = vpunpckhwd_avx2(auVar34,auVar33);
  iVar20 = (-uVar21 & 0xffff) + iVar20 * -0x10000;
  auVar33._4_4_ = iVar20;
  auVar33._0_4_ = iVar20;
  auVar33._8_4_ = iVar20;
  auVar33._12_4_ = iVar20;
  auVar33._16_4_ = iVar20;
  auVar33._20_4_ = iVar20;
  auVar33._24_4_ = iVar20;
  auVar33._28_4_ = iVar20;
  auVar30 = vpmaddwd_avx2(auVar17,auVar33);
  auVar32 = vpmaddwd_avx2(auVar31,auVar33);
  auVar17 = vpmaddwd_avx2(auVar17,auVar26);
  auVar31 = vpmaddwd_avx2(auVar31,auVar26);
  auVar30 = vpaddd_avx2(auVar30,auVar24);
  auVar32 = vpaddd_avx2(auVar32,auVar24);
  auVar17 = vpaddd_avx2(auVar17,auVar24);
  auVar31 = vpaddd_avx2(auVar31,auVar24);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar32 = vpsrad_avx2(auVar32,auVar25);
  auVar17 = vpsrad_avx2(auVar17,auVar25);
  auVar31 = vpsrad_avx2(auVar31,auVar25);
  auVar30 = vpackssdw_avx2(auVar30,auVar32);
  auVar32 = vpackssdw_avx2(auVar17,auVar31);
  auVar34 = vpunpcklwd_avx2(auVar35,auVar41);
  auVar33 = vpunpckhwd_avx2(auVar35,auVar41);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x240);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x180);
  uVar22 = iVar20 << 0x10 | uVar21 & 0xffff;
  auVar35._4_4_ = uVar22;
  auVar35._0_4_ = uVar22;
  auVar35._8_4_ = uVar22;
  auVar35._12_4_ = uVar22;
  auVar35._16_4_ = uVar22;
  auVar35._20_4_ = uVar22;
  auVar35._24_4_ = uVar22;
  auVar35._28_4_ = uVar22;
  uVar21 = uVar21 << 0x10 | -iVar20 & 0xffffU;
  auVar37._4_4_ = uVar21;
  auVar37._0_4_ = uVar21;
  auVar37._8_4_ = uVar21;
  auVar37._12_4_ = uVar21;
  auVar37._16_4_ = uVar21;
  auVar37._20_4_ = uVar21;
  auVar37._24_4_ = uVar21;
  auVar37._28_4_ = uVar21;
  auVar17 = vpmaddwd_avx2(auVar35,auVar34);
  auVar31 = vpmaddwd_avx2(auVar35,auVar33);
  auVar35 = vpmaddwd_avx2(auVar37,auVar34);
  auVar17 = vpaddd_avx2(auVar17,auVar24);
  auVar31 = vpaddd_avx2(auVar31,auVar24);
  auVar17 = vpsrad_avx2(auVar17,auVar25);
  auVar41 = vpsrad_avx2(auVar31,auVar25);
  auVar31 = vpmaddwd_avx2(auVar37,auVar33);
  alVar1 = (__m256i)vpackssdw_avx2(auVar17,auVar41);
  auVar17 = vpaddd_avx2(auVar35,auVar24);
  auVar31 = vpaddd_avx2(auVar31,auVar24);
  auVar25 = ZEXT416(uVar23);
  auVar17 = vpsrad_avx2(auVar17,auVar25);
  auVar31 = vpsrad_avx2(auVar31,auVar25);
  auVar17 = vpackssdw_avx2(auVar17,auVar31);
  auVar41 = vpunpcklwd_avx2(auVar36,auVar38);
  auVar33 = vpunpckhwd_avx2(auVar36,auVar38);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x1c0);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x200);
  uVar23 = iVar20 << 0x10 | uVar21 & 0xffff;
  auVar36._4_4_ = uVar23;
  auVar36._0_4_ = uVar23;
  auVar36._8_4_ = uVar23;
  auVar36._12_4_ = uVar23;
  auVar36._16_4_ = uVar23;
  auVar36._20_4_ = uVar23;
  auVar36._24_4_ = uVar23;
  auVar36._28_4_ = uVar23;
  uVar21 = uVar21 << 0x10 | -iVar20 & 0xffffU;
  auVar38._4_4_ = uVar21;
  auVar38._0_4_ = uVar21;
  auVar38._8_4_ = uVar21;
  auVar38._12_4_ = uVar21;
  auVar38._16_4_ = uVar21;
  auVar38._20_4_ = uVar21;
  auVar38._24_4_ = uVar21;
  auVar38._28_4_ = uVar21;
  auVar31 = vpmaddwd_avx2(auVar36,auVar41);
  auVar35 = vpmaddwd_avx2(auVar36,auVar33);
  auVar41 = vpmaddwd_avx2(auVar38,auVar41);
  auVar33 = vpmaddwd_avx2(auVar38,auVar33);
  auVar31 = vpaddd_avx2(auVar31,auVar24);
  auVar35 = vpaddd_avx2(auVar35,auVar24);
  auVar31 = vpsrad_avx2(auVar31,auVar25);
  auVar35 = vpsrad_avx2(auVar35,auVar25);
  alVar2 = (__m256i)vpackssdw_avx2(auVar31,auVar35);
  auVar31 = vpaddd_avx2(auVar41,auVar24);
  auVar35 = vpsrad_avx2(auVar31,auVar25);
  auVar31 = vpaddd_avx2(auVar33,auVar24);
  auVar31 = vpsrad_avx2(auVar31,auVar25);
  alVar3 = (__m256i)vpackssdw_avx2(auVar35,auVar31);
  auVar31 = vpaddsw_avx2(auVar39,auVar16);
  auVar41 = vpsubsw_avx2(auVar39,auVar16);
  auVar35 = vpaddsw_avx2(auVar43,auVar30);
  auVar33 = vpsubsw_avx2(auVar43,auVar30);
  auVar39 = vpaddsw_avx2(auVar18,auVar32);
  auVar36 = vpsubsw_avx2(auVar18,auVar32);
  auVar16 = vpaddsw_avx2(auVar29,auVar40);
  auVar40 = vpsubsw_avx2(auVar40,auVar29);
  auVar30 = vpunpcklwd_avx2(auVar31,auVar16);
  auVar32 = vpunpckhwd_avx2(auVar31,auVar16);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x170);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x250);
  uVar23 = iVar20 << 0x10 | uVar21 & 0xffff;
  auVar34._4_4_ = uVar23;
  auVar34._0_4_ = uVar23;
  auVar34._8_4_ = uVar23;
  auVar34._12_4_ = uVar23;
  auVar34._16_4_ = uVar23;
  auVar34._20_4_ = uVar23;
  auVar34._24_4_ = uVar23;
  auVar34._28_4_ = uVar23;
  uVar21 = uVar21 << 0x10 | -iVar20 & 0xffffU;
  auVar43._4_4_ = uVar21;
  auVar43._0_4_ = uVar21;
  auVar43._8_4_ = uVar21;
  auVar43._12_4_ = uVar21;
  auVar43._16_4_ = uVar21;
  auVar43._20_4_ = uVar21;
  auVar43._24_4_ = uVar21;
  auVar43._28_4_ = uVar21;
  auVar16 = vpmaddwd_avx2(auVar30,auVar34);
  auVar29 = vpmaddwd_avx2(auVar32,auVar34);
  auVar30 = vpmaddwd_avx2(auVar30,auVar43);
  auVar32 = vpmaddwd_avx2(auVar43,auVar32);
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  auVar31 = vpsrad_avx2(auVar16,auVar25);
  auVar16 = vpaddd_avx2(auVar29,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  alVar4 = (__m256i)vpackssdw_avx2(auVar31,auVar16);
  auVar16 = vpaddd_avx2(auVar30,auVar24);
  auVar29 = vpaddd_avx2(auVar32,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  alVar5 = (__m256i)vpackssdw_avx2(auVar16,auVar29);
  auVar30 = vpunpcklwd_avx2(auVar41,auVar40);
  auVar32 = vpunpckhwd_avx2(auVar41,auVar40);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x1d0);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x1f0);
  uVar23 = iVar20 << 0x10 | uVar21 & 0xffff;
  auVar29._4_4_ = uVar23;
  auVar29._0_4_ = uVar23;
  auVar29._8_4_ = uVar23;
  auVar29._12_4_ = uVar23;
  auVar29._16_4_ = uVar23;
  auVar29._20_4_ = uVar23;
  auVar29._24_4_ = uVar23;
  auVar29._28_4_ = uVar23;
  uVar21 = uVar21 << 0x10 | -iVar20 & 0xffffU;
  auVar31._4_4_ = uVar21;
  auVar31._0_4_ = uVar21;
  auVar31._8_4_ = uVar21;
  auVar31._12_4_ = uVar21;
  auVar31._16_4_ = uVar21;
  auVar31._20_4_ = uVar21;
  auVar31._24_4_ = uVar21;
  auVar31._28_4_ = uVar21;
  auVar16 = vpmaddwd_avx2(auVar30,auVar29);
  auVar29 = vpmaddwd_avx2(auVar32,auVar29);
  auVar30 = vpmaddwd_avx2(auVar30,auVar31);
  auVar32 = vpmaddwd_avx2(auVar32,auVar31);
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  auVar29 = vpaddd_avx2(auVar29,auVar24);
  auVar30 = vpaddd_avx2(auVar30,auVar24);
  auVar32 = vpaddd_avx2(auVar32,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  auVar32 = vpsrad_avx2(auVar32,auVar25);
  alVar6 = (__m256i)vpackssdw_avx2(auVar16,auVar29);
  alVar7 = (__m256i)vpackssdw_avx2(auVar30,auVar32);
  auVar30 = vpunpcklwd_avx2(auVar33,auVar36);
  auVar31 = vpunpckhwd_avx2(auVar33,auVar36);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 0x210);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x1b0);
  uVar23 = iVar20 << 0x10 | uVar21 & 0xffff;
  auVar32._4_4_ = uVar23;
  auVar32._0_4_ = uVar23;
  auVar32._8_4_ = uVar23;
  auVar32._12_4_ = uVar23;
  auVar32._16_4_ = uVar23;
  auVar32._20_4_ = uVar23;
  auVar32._24_4_ = uVar23;
  auVar32._28_4_ = uVar23;
  uVar21 = uVar21 << 0x10 | -iVar20 & 0xffffU;
  auVar40._4_4_ = uVar21;
  auVar40._0_4_ = uVar21;
  auVar40._8_4_ = uVar21;
  auVar40._12_4_ = uVar21;
  auVar40._16_4_ = uVar21;
  auVar40._20_4_ = uVar21;
  auVar40._24_4_ = uVar21;
  auVar40._28_4_ = uVar21;
  auVar16 = vpmaddwd_avx2(auVar30,auVar32);
  auVar29 = vpmaddwd_avx2(auVar31,auVar32);
  auVar30 = vpmaddwd_avx2(auVar40,auVar30);
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  auVar29 = vpaddd_avx2(auVar29,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar32 = vpsrad_avx2(auVar29,auVar25);
  auVar29 = vpmaddwd_avx2(auVar40,auVar31);
  alVar8 = (__m256i)vpackssdw_avx2(auVar16,auVar32);
  auVar16 = vpaddd_avx2(auVar30,auVar24);
  auVar29 = vpaddd_avx2(auVar29,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  alVar9 = (__m256i)vpackssdw_avx2(auVar16,auVar29);
  auVar30 = vpunpcklwd_avx2(auVar35,auVar39);
  auVar32 = vpunpckhwd_avx2(auVar35,auVar39);
  uVar21 = *(uint *)((long)vert_filter_length_chroma + lVar19 + 400);
  iVar20 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x230);
  uVar23 = iVar20 << 0x10 | uVar21 & 0xffff;
  auVar39._4_4_ = uVar23;
  auVar39._0_4_ = uVar23;
  auVar39._8_4_ = uVar23;
  auVar39._12_4_ = uVar23;
  auVar39._16_4_ = uVar23;
  auVar39._20_4_ = uVar23;
  auVar39._24_4_ = uVar23;
  auVar39._28_4_ = uVar23;
  uVar21 = uVar21 << 0x10 | -iVar20 & 0xffffU;
  auVar41._4_4_ = uVar21;
  auVar41._0_4_ = uVar21;
  auVar41._8_4_ = uVar21;
  auVar41._12_4_ = uVar21;
  auVar41._16_4_ = uVar21;
  auVar41._20_4_ = uVar21;
  auVar41._24_4_ = uVar21;
  auVar41._28_4_ = uVar21;
  auVar16 = vpmaddwd_avx2(auVar39,auVar30);
  auVar29 = vpmaddwd_avx2(auVar32,auVar39);
  auVar30 = vpmaddwd_avx2(auVar41,auVar30);
  auVar32 = vpmaddwd_avx2(auVar32,auVar41);
  auVar16 = vpaddd_avx2(auVar16,auVar24);
  auVar29 = vpaddd_avx2(auVar29,auVar24);
  auVar30 = vpaddd_avx2(auVar30,auVar24);
  auVar32 = vpaddd_avx2(auVar32,auVar24);
  auVar16 = vpsrad_avx2(auVar16,auVar25);
  auVar29 = vpsrad_avx2(auVar29,auVar25);
  auVar30 = vpsrad_avx2(auVar30,auVar25);
  alVar10 = (__m256i)vpackssdw_avx2(auVar16,auVar29);
  auVar16 = vpsrad_avx2(auVar32,auVar25);
  alVar11 = (__m256i)vpackssdw_avx2(auVar30,auVar16);
  local_a8 = auVar12._0_8_;
  lStack_a0 = auVar12._8_8_;
  lStack_98 = auVar12._16_8_;
  lStack_90 = auVar12._24_8_;
  (*output)[0] = local_a8;
  (*output)[1] = lStack_a0;
  (*output)[2] = lStack_98;
  (*output)[3] = lStack_90;
  output[1] = alVar4;
  output[2] = alVar1;
  output[3] = alVar11;
  local_c8 = auVar14._0_8_;
  lStack_c0 = auVar14._8_8_;
  lStack_b8 = auVar14._16_8_;
  lStack_b0 = auVar14._24_8_;
  output[4][0] = local_c8;
  output[4][1] = lStack_c0;
  output[4][2] = lStack_b8;
  output[4][3] = lStack_b0;
  output[5] = alVar8;
  output[6] = alVar3;
  output[7] = alVar7;
  local_88 = auVar13._0_8_;
  lStack_80 = auVar13._8_8_;
  lStack_78 = auVar13._16_8_;
  lStack_70 = auVar13._24_8_;
  output[8][0] = local_88;
  output[8][1] = lStack_80;
  output[8][2] = lStack_78;
  output[8][3] = lStack_70;
  output[9] = alVar6;
  output[10] = alVar2;
  output[0xb] = alVar9;
  local_e8 = auVar15._0_8_;
  lStack_e0 = auVar15._8_8_;
  lStack_d8 = auVar15._16_8_;
  lStack_d0 = auVar15._24_8_;
  output[0xc][0] = local_e8;
  output[0xc][1] = lStack_e0;
  output[0xc][2] = lStack_d8;
  output[0xc][3] = lStack_d0;
  output[0xd] = alVar10;
  local_108 = auVar17._0_8_;
  lStack_100 = auVar17._8_8_;
  lStack_f8 = auVar17._16_8_;
  lStack_f0 = auVar17._24_8_;
  output[0xe][0] = local_108;
  output[0xe][1] = lStack_100;
  output[0xe][2] = lStack_f8;
  output[0xe][3] = lStack_f0;
  output[0xf] = alVar5;
  return;
}

Assistant:

static inline void fdct16x16_new_avx2(const __m256i *input, __m256i *output,
                                      int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);

  // stage 1
  __m256i x1[16];
  btf_16_adds_subs_out_avx2(&x1[0], &x1[15], input[0], input[15]);
  btf_16_adds_subs_out_avx2(&x1[1], &x1[14], input[1], input[14]);
  btf_16_adds_subs_out_avx2(&x1[2], &x1[13], input[2], input[13]);
  btf_16_adds_subs_out_avx2(&x1[3], &x1[12], input[3], input[12]);
  btf_16_adds_subs_out_avx2(&x1[4], &x1[11], input[4], input[11]);
  btf_16_adds_subs_out_avx2(&x1[5], &x1[10], input[5], input[10]);
  btf_16_adds_subs_out_avx2(&x1[6], &x1[9], input[6], input[9]);
  btf_16_adds_subs_out_avx2(&x1[7], &x1[8], input[7], input[8]);

  // stage 2
  btf_16_adds_subs_avx2(&x1[0], &x1[7]);
  btf_16_adds_subs_avx2(&x1[1], &x1[6]);
  btf_16_adds_subs_avx2(&x1[2], &x1[5]);
  btf_16_adds_subs_avx2(&x1[3], &x1[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[11], &x1[12], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[11]);
  btf_16_adds_subs_avx2(&x1[9], &x1[10]);
  btf_16_adds_subs_avx2(&x1[15], &x1[12]);
  btf_16_adds_subs_avx2(&x1[14], &x1[13]);

  // stage 4
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x1[2], &x1[3], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r, cos_bit);

  // stage 5
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x1[4], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);

  // stage 6
  btf_16_w16_avx2(cospi_p60_p04, cospi_m04_p60, &x1[8], &x1[15], _r, cos_bit);
  btf_16_w16_avx2(cospi_p28_p36, cospi_m36_p28, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_p44_p20, cospi_m20_p44, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p12_p52, cospi_m52_p12, &x1[11], &x1[12], _r, cos_bit);

  // stage 7
  output[0] = x1[0];
  output[1] = x1[8];
  output[2] = x1[4];
  output[3] = x1[12];
  output[4] = x1[2];
  output[5] = x1[10];
  output[6] = x1[6];
  output[7] = x1[14];
  output[8] = x1[1];
  output[9] = x1[9];
  output[10] = x1[5];
  output[11] = x1[13];
  output[12] = x1[3];
  output[13] = x1[11];
  output[14] = x1[7];
  output[15] = x1[15];
}